

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::setFrameBuffer
          (DeepScanLineOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr name;
  int iVar1;
  Data *pDVar2;
  undefined8 uVar3;
  pointer ppOVar4;
  _Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  *this_00;
  ptrdiff_t pVar5;
  DeepScanLineOutputFile *pDVar6;
  pointer ppOVar7;
  ChannelList *this_01;
  const_iterator cVar8;
  ConstIterator CVar9;
  ConstIterator CVar10;
  const_iterator cVar11;
  Slice *pSVar12;
  pointer ppOVar13;
  ostream *poVar14;
  char *pcVar15;
  ArgExc *pAVar16;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar17;
  size_t i;
  ulong uVar18;
  pointer ppOVar19;
  ulong __n_00;
  value_type local_1d8;
  DeepScanLineOutputFile *local_1d0;
  Lock local_1c8;
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  slices;
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  this_01 = Header::channels(&this->_data->header);
  for (cVar8._M_node = (_Base_ptr)ChannelList::begin(this_01); CVar9 = ChannelList::end(this_01),
      (const_iterator)cVar8._M_node != CVar9._i._M_node;
      cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node)) {
    name = cVar8._M_node + 1;
    CVar10 = DeepFrameBuffer::find(frameBuffer,(char *)name);
    cVar11._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar10._i._M_node != (const_iterator)cVar11._M_node) {
      if (cVar8._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar10._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar14 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "Pixel type of \"");
        poVar14 = std::operator<<(poVar14,(char *)name);
        poVar14 = std::operator<<(poVar14,"\" channel of output file \"");
        pcVar15 = fileName(this);
        poVar14 = std::operator<<(poVar14,pcVar15);
        std::operator<<(poVar14,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&slices);
        __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((*(int *)&cVar8._M_node[9].field_0x4 != *(int *)((long)CVar10._i._M_node + 0x140)) ||
         (*(int *)&cVar8._M_node[9]._M_parent != *(int *)((long)CVar10._i._M_node + 0x144))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&slices);
        poVar14 = std::operator<<((ostream *)
                                  &slices.
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "X and/or y subsampling factors of \"");
        poVar14 = std::operator<<(poVar14,(char *)name);
        poVar14 = std::operator<<(poVar14,"\" channel of output file \"");
        pcVar15 = fileName(this);
        poVar14 = std::operator<<(poVar14,pcVar15);
        std::operator<<(poVar14,
                        "\" are not compatible with the frame buffer\'s subsampling factors.");
        pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&slices);
        __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
  }
  pSVar12 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar12->base == (char *)0x0) {
    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar16,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar2 = this->_data;
  pDVar2->sampleCountSliceBase = pSVar12->base;
  sVar17 = pSVar12->yStride;
  pDVar2->sampleCountXStride = (int)pSVar12->xStride;
  pDVar2->sampleCountYStride = (int)sVar17;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = this;
  cVar8._M_node = (_Base_ptr)ChannelList::begin(this_01);
  for (; CVar9 = ChannelList::end(this_01), pDVar6 = local_1d0,
      (const_iterator)cVar8._M_node != CVar9._i._M_node;
      cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node)) {
    CVar10 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar8._M_node + 1));
    cVar11._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar10._i._M_node == (const_iterator)cVar11._M_node) {
      local_1d8 = (value_type)operator_new(0x38);
      local_1d8->type = cVar8._M_node[9]._M_color;
      uVar3 = *(undefined8 *)&cVar8._M_node[9].field_0x4;
      local_1d8->xStride = 0;
      local_1d8->yStride = 0;
      local_1d8->base = (char *)0x0;
      local_1d8->sampleStride = 0;
      local_1d8->xSampling = (int)uVar3;
      local_1d8->ySampling = (int)((ulong)uVar3 >> 0x20);
      local_1d8->zero = true;
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back(&slices,&local_1d8);
    }
    else {
      local_1d8 = (value_type)operator_new(0x38);
      pcVar15 = *(char **)((long)CVar10._i._M_node + 0x128);
      iVar1 = *(int *)((long)CVar10._i._M_node + 0x154);
      local_1d8->type = *(PixelType *)((long)CVar10._i._M_node + 0x120);
      local_1d8->base = pcVar15;
      local_1d8->sampleStride = (long)iVar1;
      pVar5 = *(ptrdiff_t *)((long)CVar10._i._M_node + 0x138);
      local_1d8->xStride = *(ptrdiff_t *)((long)CVar10._i._M_node + 0x130);
      local_1d8->yStride = pVar5;
      uVar3 = *(undefined8 *)((long)CVar10._i._M_node + 0x140);
      local_1d8->xSampling = (int)uVar3;
      local_1d8->ySampling = (int)((ulong)uVar3 >> 0x20);
      local_1d8->zero = false;
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ::push_back(&slices,&local_1d8);
    }
  }
  DeepFrameBuffer::operator=(&local_1d0->_data->frameBuffer,frameBuffer);
  uVar18 = 0;
  while( true ) {
    pDVar2 = pDVar6->_data;
    ppOVar13 = (pDVar2->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppOVar4 = (pDVar2->slices).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)ppOVar4 - (long)ppOVar13;
    if ((ulong)((long)__n >> 3) <= uVar18) break;
    frameBuffer = (DeepFrameBuffer *)&DAT_00000038;
    operator_delete(ppOVar13[uVar18],0x38);
    uVar18 = uVar18 + 1;
  }
  ppOVar19 = slices.
             super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppOVar7 = slices.
            super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar18 = (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pDVar2->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar13) < uVar18) {
    ppOVar13 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                              *)((long)uVar18 >> 3),(size_t)frameBuffer);
    sVar17 = extraout_RDX;
    if (ppOVar7 != ppOVar19) {
      memcpy(ppOVar13,ppOVar19,uVar18);
      sVar17 = extraout_RDX_00;
    }
    this_00 = (_Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
               *)(pDVar2->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(pDVar2->slices).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),sVar17);
    (pDVar2->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppOVar13;
    (pDVar2->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppOVar13 + uVar18);
  }
  else {
    if (__n < uVar18) {
      if (ppOVar4 != ppOVar13) {
        memmove(ppOVar13,slices.
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__n);
        ppOVar4 = (pDVar2->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppOVar4 -
              (long)(pDVar2->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      ppOVar13 = ppOVar4;
      ppOVar19 = (pointer)((long)ppOVar19 + __n);
      __n_00 = (long)ppOVar7 - (long)ppOVar19;
      if (__n_00 == 0) goto LAB_0015652d;
    }
    else {
      __n_00 = uVar18;
      if (slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          slices.
          super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_0015652d;
    }
    memmove(ppOVar13,ppOVar19,__n_00);
  }
LAB_0015652d:
  (pDVar2->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar18 + (long)(pDVar2->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
  ::~vector(&slices);
  IlmThread_2_5::Lock::~Lock(&local_1c8);
  return;
}

Assistant:

void
DeepScanLineOutputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
            continue;

        if (i.channel().type != j.slice().type)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" is "
                                "not compatible with the frame buffer's "
                                "pixel type.");
        }

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
        {
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
        }
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    // (TODO) Support for different sampling rates?
    //

    vector<OutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new OutSliceInfo (i.channel().type,
                                                NULL,// base
                                                0,// sampleStride,
                                                0,// xStride
                                                0,// yStride
                                                i.channel().xSampling,
                                                i.channel().ySampling,
                                                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new OutSliceInfo (j.slice().type,
                                                j.slice().base,                      
                                                j.slice().sampleStride,
                                                j.slice().xStride,
                                                j.slice().yStride,
                                                j.slice().xSampling,
                                                j.slice().ySampling,
                                                false)); // zero

        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}